

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O0

void __thiscall QStaticText::prepare(QStaticText *this,QTransform *matrix,QFont *font)

{
  QStaticTextPrivate *pQVar1;
  EVP_PKEY_CTX *in_RDX;
  QFont *in_RSI;
  QFont *in_stack_ffffffffffffffc8;
  
  pQVar1 = QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x793240);
  memcpy(&pQVar1->matrix,in_RSI,0x4a);
  QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
            ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x79326a);
  QFont::operator=(in_RSI,in_stack_ffffffffffffffc8);
  pQVar1 = QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x793285);
  QStaticTextPrivate::init(pQVar1,in_RDX);
  return;
}

Assistant:

void QStaticText::prepare(const QTransform &matrix, const QFont &font)
{
    data->matrix = matrix;
    data->font = font;
    data->init();
}